

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIndexingTests.cpp
# Opt level: O2

int __thiscall deqp::ShaderIndexingTests::init(ShaderIndexingTests *this,EVP_PKEY_CTX *ctx)

{
  GLSLVersion GVar1;
  Context *pCVar2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  int iVar5;
  int iVar6;
  DataType DVar7;
  TestCaseGroup *pTVar8;
  char *pcVar9;
  char *pcVar10;
  ostream *poVar11;
  ShaderIndexingCase *pSVar12;
  ShaderEvalFunc p_Var13;
  long lVar14;
  char *pcVar15;
  char *__s;
  char *pcVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  undefined8 *puVar22;
  char *pcVar23;
  ulong uVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar25;
  ulong uVar26;
  ShaderIndexingTests *pSVar27;
  string *psVar28;
  bool isVertexCase;
  allocator<char> local_4c1;
  long local_4c0;
  ulong local_4b8;
  char *local_4b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  string vertexShaderSource;
  StringTemplate fragTemplate;
  uint local_430;
  uint local_420;
  string local_418;
  TestCaseGroup *local_3f8;
  TestCaseGroup *local_3f0;
  Context *local_3e8;
  ShaderIndexingTests *local_3e0;
  Context *local_3d8;
  uint local_3cc;
  TestCaseGroup *local_3c8;
  char *local_3c0;
  StringTemplate vertTemplate;
  string desc;
  string name;
  ostringstream vtx;
  ostringstream frag;
  
  pTVar8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar8,(this->super_TestCaseGroup).m_context,"varying_array",
             "Varying array access tests.");
  local_3e0 = this;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar8);
  pcVar10 = (char *)0x0;
  while (pcVar10 != &DAT_00000004) {
    local_4b8 = CONCAT44(local_4b8._4_4_,
                         deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes
                         [(long)pcVar10]);
    pcVar23 = (char *)0x0;
    local_3f8 = (TestCaseGroup *)pcVar10;
    while (pcVar23 != &DAT_00000004) {
      local_3f0 = (TestCaseGroup *)0x17d2f02;
      if (pcVar23 == (char *)0x2) {
        local_3f0 = (TestCaseGroup *)0x17d2e9a;
      }
      local_3e8 = (Context *)0x17d2c9f;
      if (pcVar23 == &DAT_00000001) {
        local_3e8 = (Context *)0x17d2c67;
      }
      local_430 = (uint)pcVar23 | 2;
      puVar22 = &getIndexAccessTypeName(deqp::IndexAccessType)::s_names;
      lVar14 = 0;
      local_4b0 = pcVar23;
      while (lVar14 != 4) {
        local_4c0 = lVar14;
        if ((int)lVar14 != 0 || (int)local_4b0 != 0) {
          pcVar10 = (char *)(&getIndexAccessTypeName(deqp::IndexAccessType)::s_names)
                            [(long)local_4b0];
          pcVar23 = (char *)*puVar22;
          pcVar9 = glu::getDataTypeName((DataType)local_4b8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fragTemplate.m_template,pcVar9,
                     (allocator<char> *)&vertexShaderSource);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,&fragTemplate.m_template,"_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vertTemplate,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,pcVar10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vertTemplate,"_write_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         pcVar23);
          std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vtx,"_read");
          std::__cxx11::string::~string((string *)&vtx);
          std::__cxx11::string::~string((string *)&frag);
          std::__cxx11::string::~string((string *)&vertTemplate);
          std::__cxx11::string::~string((string *)&params);
          std::__cxx11::string::~string((string *)&fragTemplate);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&params,"Varying array with ",(allocator<char> *)&fragTemplate);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vertTemplate,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,pcVar10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vertTemplate," write in vertex shader and ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         pcVar23);
          std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vtx," read in fragment shader.");
          std::__cxx11::string::~string((string *)&vtx);
          std::__cxx11::string::~string((string *)&frag);
          std::__cxx11::string::~string((string *)&vertTemplate);
          std::__cxx11::string::~string((string *)&params);
          _Var3 = name._M_dataplus;
          pCVar2 = (local_3e0->super_TestCaseGroup).m_context;
          local_3d8 = (Context *)desc._M_dataplus._M_p;
          GVar1 = local_3e0->m_glslVersion;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
          pcVar10 = glu::getGLSLVersionDeclaration(GVar1);
          poVar11 = std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10)
          ;
          std::operator<<(poVar11,"\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "in highp vec4 a_position;\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "in highp vec4 a_coords;\n");
          if (local_430 == 3) {
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            (char *)local_3e8);
          }
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "out ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "    gl_Position = a_position;\n");
          if (local_4b0 == (char *)0x0) {
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "    var[0] = ${VAR_TYPE}(a_coords);\n");
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "    var[1] = ${VAR_TYPE}(a_coords) * 0.5;\n");
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "    var[2] = ${VAR_TYPE}(a_coords) * 0.25;\n");
            pcVar10 = "    var[3] = ${VAR_TYPE}(a_coords) * 0.125;\n";
          }
          else if (local_4b0 == &DAT_00000001) {
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "    var[ui_zero]  = ${VAR_TYPE}(a_coords);\n");
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "    var[ui_one]   = ${VAR_TYPE}(a_coords) * 0.5;\n");
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "    var[ui_two]   = ${VAR_TYPE}(a_coords) * 0.25;\n");
            pcVar10 = "    var[ui_three] = ${VAR_TYPE}(a_coords) * 0.125;\n";
          }
          else {
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "    ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n");
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            (char *)local_3f0);
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"    {\n");
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "        var[i] = ${VAR_TYPE}(coords);\n");
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "        coords = coords * 0.5;\n");
            pcVar10 = "    }\n";
          }
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10);
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
          pcVar10 = glu::getGLSLVersionDeclaration(GVar1);
          poVar11 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10
                                   );
          std::operator<<(poVar11,"\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                          "precision mediump int;\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                          "layout(location = 0) out mediump vec4 o_color;\n");
          pcVar10 = "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n";
          if ((local_4c0 == 1) || (pcVar10 = "uniform int ui_four;\n", local_4c0 == 3)) {
            std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10);
          }
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                          "in ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                          "   ${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n");
          if (local_4c0 == 0) {
            std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                            "   res += var[0];\n");
            std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                            "   res += var[1];\n");
            std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                            "   res += var[2];\n");
            pcVar10 = "   res += var[3];\n";
          }
          else if (local_4c0 == 1) {
            std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                            "   res += var[ui_zero];\n");
            std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                            "   res += var[ui_one];\n");
            std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                            "   res += var[ui_two];\n");
            pcVar10 = "   res += var[ui_three];\n";
          }
          else {
            pcVar10 = "    for (int i = 0; i < ui_four; i++)\n";
            if (local_4c0 == 2) {
              pcVar10 = "    for (int i = 0; i < 4; i++)\n";
            }
            std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10 + 1);
            pcVar10 = "       res += var[i];\n";
          }
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10);
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                          "   o_color = vec4(res${PADDING});\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &params._M_t._M_impl.super__Rb_tree_header._M_header;
          params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName((DataType)local_4b8);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[9],_const_char_*,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [9])0x17d62f1,(char **)&fragTemplate);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x18164bb);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [10])0x1906f6b,(char (*) [8])0x18152ad);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          if ((DataType)local_4b8 == 3) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x17d30c1);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          else if ((DataType)local_4b8 == 2) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x17d30bc);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          else if ((DataType)local_4b8 == 1) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0");
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          else {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",
                       (char (*) [1])(glcts::fixed_sample_locations_values + 1));
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                     (allocator<char> *)&local_418);
          tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
          std::__cxx11::string::~string((string *)&fragTemplate.m_template);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexShaderSource,local_418._M_dataplus._M_p,&local_4c1);
          tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          std::__cxx11::string::~string((string *)&local_418);
          tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
          tcu::StringTemplate::specialize(&local_418,&fragTemplate,&params);
          pSVar12 = (ShaderIndexingCase *)operator_new(0x130);
          DVar7 = (DataType)local_4b8;
          p_Var13 = getArrayCoordsEvalFunc((DataType)local_4b8);
          ShaderIndexingCase::ShaderIndexingCase
                    (pSVar12,pCVar2,_Var3._M_p,(char *)local_3d8,true,DVar7,p_Var13,
                     vertexShaderSource._M_dataplus._M_p,local_418._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          tcu::StringTemplate::~StringTemplate(&fragTemplate);
          tcu::StringTemplate::~StringTemplate(&vertTemplate);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&params);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
          tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)pSVar12);
          std::__cxx11::string::~string((string *)&desc);
          std::__cxx11::string::~string((string *)&name);
        }
        puVar22 = puVar22 + 1;
        lVar14 = local_4c0 + 1;
      }
      pcVar23 = local_4b0 + 1;
    }
    pcVar10 = (char *)((long)local_3f8 + 1);
  }
  pTVar8 = (TestCaseGroup *)operator_new(0x78);
  pSVar27 = local_3e0;
  TestCaseGroup::TestCaseGroup
            (pTVar8,(local_3e0->super_TestCaseGroup).m_context,"uniform_array",
             "Uniform array access tests.");
  local_3f0 = pTVar8;
  tcu::TestNode::addChild((TestNode *)pSVar27,(TestNode *)pTVar8);
  uVar19 = 0;
  while (uVar19 != 4) {
    local_4b8 = (ulong)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes[uVar19];
    local_3e8 = (Context *)
                (ulong)(deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes[uVar19] -
                       TYPE_FLOAT);
    local_3c8 = (TestCaseGroup *)uVar19;
    for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
      local_3c0 = "    for (int i = 0; i < ui_four; i++)\n";
      if (lVar14 == 2) {
        local_3c0 = "    for (int i = 0; i < 4; i++)\n";
      }
      local_3c0 = local_3c0 + 3;
      local_3f8 = (TestCaseGroup *)0x17d2c9f;
      if (lVar14 == 1) {
        local_3f8 = (TestCaseGroup *)0x17d2c67;
      }
      local_4b0 = (char *)(&getIndexAccessTypeName(deqp::IndexAccessType)::s_names)[lVar14];
      local_420 = (uint)lVar14 | 2;
      lVar18 = 0;
      while (lVar18 != 8) {
        local_4c0 = lVar18;
        pcVar10 = glu::getShaderTypeName
                            (*(ShaderType *)
                              ((long)deqp::gles2::Functional::UniformCase::
                                     randomFeatures(unsigned_int)::arrayUsageChoices + lVar18));
        pcVar23 = glu::getDataTypeName((DataType)local_4b8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&params,pcVar23,(allocator<char> *)&fragTemplate);
        std::operator+(&vertTemplate.m_template,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                       "_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                       &vertTemplate.m_template,local_4b0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                       "_read_");
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vtx,pcVar10);
        std::__cxx11::string::~string((string *)&vtx);
        std::__cxx11::string::~string((string *)&frag);
        std::__cxx11::string::~string((string *)&vertTemplate.m_template);
        std::__cxx11::string::~string((string *)&params);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&params,"Uniform array with ",(allocator<char> *)&fragTemplate);
        std::operator+(&vertTemplate.m_template,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                       local_4b0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                       &vertTemplate.m_template," read in ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                       pcVar10);
        std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vtx," shader.");
        std::__cxx11::string::~string((string *)&vtx);
        std::__cxx11::string::~string((string *)&frag);
        std::__cxx11::string::~string((string *)&vertTemplate);
        std::__cxx11::string::~string((string *)&params);
        _Var4 = name._M_dataplus;
        _Var3 = desc._M_dataplus;
        pCVar2 = (local_3e0->super_TestCaseGroup).m_context;
        GVar1 = local_3e0->m_glslVersion;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
        pbVar25 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag;
        if (local_4c0 == 0) {
          pbVar25 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx;
        }
        local_3d8 = pCVar2;
        pcVar10 = glu::getGLSLVersionDeclaration(GVar1);
        poVar11 = std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10);
        std::operator<<(poVar11,"\n");
        pcVar10 = glu::getGLSLVersionDeclaration(GVar1);
        poVar11 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10);
        std::operator<<(poVar11,"\n");
        std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                        "in highp vec4 a_position;\n");
        std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                        "in highp vec4 a_coords;\n");
        std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                        "layout(location = 0) out mediump vec4 o_color;\n");
        if (local_4c0 == 0) {
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "out mediump vec4 v_color;\n");
          pcVar10 = "in mediump vec4 v_color;\n";
        }
        else {
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "out mediump vec4 v_coords;\n");
          pcVar10 = "in mediump vec4 v_coords;\n";
        }
        std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10);
        if (local_420 == 3) {
          std::operator<<((ostream *)pbVar25,(char *)local_3f8);
        }
        std::operator<<((ostream *)pbVar25,"uniform ${PRECISION} ${VAR_TYPE} u_arr[${ARRAY_LEN}];\n"
                       );
        std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
        std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
        std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
        std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                        "    gl_Position = a_position;\n");
        std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
        std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
        std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
        std::operator<<((ostream *)pbVar25," ${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n");
        if (lVar14 == 0) {
          std::operator<<((ostream *)pbVar25," res += u_arr[0];\n");
          std::operator<<((ostream *)pbVar25," res += u_arr[1];\n");
          std::operator<<((ostream *)pbVar25," res += u_arr[2];\n");
          pcVar10 = " res += u_arr[3];\n";
        }
        else if (lVar14 == 1) {
          std::operator<<((ostream *)pbVar25," res += u_arr[ui_zero];\n");
          std::operator<<((ostream *)pbVar25," res += u_arr[ui_one];\n");
          std::operator<<((ostream *)pbVar25," res += u_arr[ui_two];\n");
          pcVar10 = " res += u_arr[ui_three];\n";
        }
        else {
          std::operator<<((ostream *)pbVar25,local_3c0);
          pcVar10 = "     res += u_arr[i];\n";
        }
        std::operator<<((ostream *)pbVar25,pcVar10);
        if (local_4c0 == 0) {
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "    v_color = vec4(res${PADDING});\n");
          pcVar10 = "   o_color = v_color;\n";
        }
        else {
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "    v_coords = a_coords;\n");
          pcVar10 = "   o_color = vec4(res${PADDING});\n";
        }
        std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10);
        std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
        std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &params._M_t._M_impl.super__Rb_tree_header._M_header;
        params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName((DataType)local_4b8);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[9],_const_char_*,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [9])0x17d62f1,(char **)&fragTemplate);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x18164bb);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])0x1906f6b,(char (*) [8])0x18152ad);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&vertTemplate);
        iVar5 = (int)local_4b8;
        if (iVar5 == 3) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x17d30c1);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if (iVar5 == 2) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x17d30bc);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if (iVar5 == 1) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0");
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",
                     (char (*) [1])(glcts::fixed_sample_locations_values + 1));
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&vertTemplate);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                   (allocator<char> *)&local_418);
        tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
        std::__cxx11::string::~string((string *)&fragTemplate.m_template);
        std::__cxx11::string::~string((string *)&vertexShaderSource);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vertexShaderSource,local_418._M_dataplus._M_p,&local_4c1);
        tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
        std::__cxx11::string::~string((string *)&vertexShaderSource);
        std::__cxx11::string::~string((string *)&local_418);
        tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
        tcu::StringTemplate::specialize(&local_418,&fragTemplate,&params);
        if ((uint)local_3e8 < 4) {
          p_Var13 = (ShaderEvalFunc)(&PTR_evalArrayUniformFloat_01e05980)[(long)local_3e8];
        }
        else {
          p_Var13 = (ShaderEvalFunc)0x0;
        }
        pSVar12 = (ShaderIndexingCase *)operator_new(0x130);
        ShaderIndexingCase::ShaderIndexingCase
                  (pSVar12,local_3d8,_Var4._M_p,_Var3._M_p,local_4c0 == 0,(DataType)local_4b8,
                   p_Var13,vertexShaderSource._M_dataplus._M_p,local_418._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&vertexShaderSource);
        tcu::StringTemplate::~StringTemplate(&fragTemplate);
        tcu::StringTemplate::~StringTemplate(&vertTemplate);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&params._M_t);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
        tcu::TestNode::addChild((TestNode *)local_3f0,(TestNode *)pSVar12);
        std::__cxx11::string::~string((string *)&desc);
        std::__cxx11::string::~string((string *)&name);
        lVar18 = local_4c0 + 4;
      }
    }
    uVar19 = (long)local_3c8 + 1;
  }
  pTVar8 = (TestCaseGroup *)operator_new(0x78);
  pSVar27 = local_3e0;
  TestCaseGroup::TestCaseGroup
            (pTVar8,(local_3e0->super_TestCaseGroup).m_context,"tmp_array",
             "Temporary array access tests.");
  local_3f8 = pTVar8;
  tcu::TestNode::addChild((TestNode *)pSVar27,(TestNode *)pTVar8);
  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
    local_4b8 = CONCAT44(local_4b8._4_4_,
                         deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes[lVar14]);
    iVar5 = 0;
    while( true ) {
      local_4b0 = (char *)CONCAT44(local_4b0._4_4_,iVar5);
      if (iVar5 == 2) break;
      uVar17 = 1;
      while (uVar17 != 4) {
        local_3c8 = (TestCaseGroup *)0x0;
        if ((int)local_4b0 == 0) {
          local_3c8 = (TestCaseGroup *)(ulong)uVar17;
        }
        local_3c0 = (char *)(ulong)uVar17;
        if ((int)local_4b0 == 0) {
          local_3c0 = (char *)0x0;
        }
        pcVar10 = (char *)(&getIndexAccessTypeName(deqp::IndexAccessType)::s_names)[(long)local_3c0]
        ;
        pcVar23 = (char *)(&getIndexAccessTypeName(deqp::IndexAccessType)::s_names)[(long)local_3c8]
        ;
        iVar5 = (int)local_3c8;
        local_3e8 = (Context *)CONCAT71(local_3e8._1_7_,iVar5 == 1 || (int)local_3c0 == 1);
        local_3f0 = (TestCaseGroup *)CONCAT71(local_3f0._1_7_,iVar5 == 3 || (int)local_3c0 == 3);
        pcVar16 = "    for (int i = 0; i < ui_four; i++)\n";
        pcVar9 = "    for (int i = 0; i < ui_four; i++)\n";
        if (uVar17 == 2) {
          pcVar9 = "    for (int i = 0; i < 4; i++)\n";
        }
        if (iVar5 == 2) {
          pcVar16 = "    for (int i = 0; i < 4; i++)\n";
        }
        lVar18 = 0;
        local_3cc = uVar17;
        while (lVar18 != 8) {
          local_4c0 = lVar18;
          pcVar15 = glu::getShaderTypeName
                              (*(ShaderType *)
                                ((long)deqp::gles2::Functional::UniformCase::
                                       randomFeatures(unsigned_int)::arrayUsageChoices + lVar18));
          __s = glu::getDataTypeName((DataType)local_4b8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexShaderSource,__s,(allocator<char> *)&local_418);
          std::operator+(&fragTemplate.m_template,&vertexShaderSource,"_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,&fragTemplate.m_template,pcVar10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vertTemplate,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,"_write_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vertTemplate,pcVar23);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         "_read_");
          std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vtx,pcVar15);
          std::__cxx11::string::~string((string *)&vtx);
          std::__cxx11::string::~string((string *)&frag);
          std::__cxx11::string::~string((string *)&vertTemplate);
          std::__cxx11::string::~string((string *)&params);
          std::__cxx11::string::~string((string *)&fragTemplate.m_template);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexShaderSource,"Temporary array with ",
                     (allocator<char> *)&local_418);
          std::operator+(&fragTemplate.m_template,&vertexShaderSource,pcVar10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,&fragTemplate.m_template," write and ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vertTemplate,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,pcVar23);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vertTemplate," read in ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         pcVar15);
          std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vtx," shader.");
          std::__cxx11::string::~string((string *)&vtx);
          std::__cxx11::string::~string((string *)&frag);
          std::__cxx11::string::~string((string *)&vertTemplate);
          std::__cxx11::string::~string((string *)&params);
          std::__cxx11::string::~string((string *)&fragTemplate);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          _Var4 = name._M_dataplus;
          _Var3 = desc._M_dataplus;
          local_3d8 = (local_3e0->super_TestCaseGroup).m_context;
          GVar1 = local_3e0->m_glslVersion;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
          psVar28 = (string *)&frag;
          if (local_4c0 == 0) {
            psVar28 = (string *)&vtx;
          }
          pcVar15 = glu::getGLSLVersionDeclaration(GVar1);
          poVar11 = std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar15)
          ;
          std::operator<<(poVar11,"\n");
          pcVar15 = glu::getGLSLVersionDeclaration(GVar1);
          poVar11 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar15
                                   );
          std::operator<<(poVar11,"\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "in highp vec4 a_position;\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "in highp vec4 a_coords;\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                          "layout(location = 0) out mediump vec4 o_color;\n");
          if (local_4c0 == 0) {
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "out mediump vec4 v_color;\n");
            pcVar15 = "in mediump vec4 v_color;\n";
          }
          else {
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "out mediump vec4 v_coords;\n");
            pcVar15 = "in mediump vec4 v_coords;\n";
          }
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar15);
          if ((char)local_3e8 != '\0') {
            std::operator<<((ostream *)psVar28,
                            "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n");
          }
          if ((char)local_3f0 != '\0') {
            std::operator<<((ostream *)psVar28,"uniform mediump int ui_four;\n");
          }
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "    gl_Position = a_position;\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
          pcVar15 = " ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";
          if (local_4c0 == 0) {
            pcVar15 = " ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
          }
          std::operator<<((ostream *)psVar28,pcVar15);
          std::operator<<((ostream *)psVar28," ${PRECISION} ${VAR_TYPE} arr[${ARRAY_LEN}];\n");
          if ((int)local_4b0 == 0) {
            std::operator<<((ostream *)psVar28," arr[0] = ${VAR_TYPE}(coords);\n");
            std::operator<<((ostream *)psVar28," arr[1] = ${VAR_TYPE}(coords) * 0.5;\n");
            std::operator<<((ostream *)psVar28," arr[2] = ${VAR_TYPE}(coords) * 0.25;\n");
            pcVar15 = " arr[3] = ${VAR_TYPE}(coords) * 0.125;\n";
          }
          else if ((int)local_3c0 == 1) {
            std::operator<<((ostream *)psVar28," arr[ui_zero]  = ${VAR_TYPE}(coords);\n");
            std::operator<<((ostream *)psVar28," arr[ui_one]   = ${VAR_TYPE}(coords) * 0.5;\n");
            std::operator<<((ostream *)psVar28," arr[ui_two]   = ${VAR_TYPE}(coords) * 0.25;\n");
            pcVar15 = " arr[ui_three] = ${VAR_TYPE}(coords) * 0.125;\n";
          }
          else {
            std::operator<<((ostream *)psVar28,pcVar9 + 3);
            std::operator<<((ostream *)psVar28," {\n");
            std::operator<<((ostream *)psVar28,"     arr[i] = ${VAR_TYPE}(coords);\n");
            std::operator<<((ostream *)psVar28,"     coords = coords * 0.5;\n");
            pcVar15 = " }\n";
          }
          std::operator<<((ostream *)psVar28,pcVar15);
          std::operator<<((ostream *)psVar28," ${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n");
          if ((int)local_4b0 == 0) {
            if ((int)local_3c8 == 1) {
              std::operator<<((ostream *)psVar28," res += arr[ui_zero];\n");
              std::operator<<((ostream *)psVar28," res += arr[ui_one];\n");
              std::operator<<((ostream *)psVar28," res += arr[ui_two];\n");
              pcVar15 = " res += arr[ui_three];\n";
            }
            else {
              std::operator<<((ostream *)psVar28,pcVar16 + 3);
              pcVar15 = "     res += arr[i];\n";
            }
          }
          else {
            std::operator<<((ostream *)psVar28," res += arr[0];\n");
            std::operator<<((ostream *)psVar28," res += arr[1];\n");
            std::operator<<((ostream *)psVar28," res += arr[2];\n");
            pcVar15 = " res += arr[3];\n";
          }
          std::operator<<((ostream *)psVar28,pcVar15);
          if (local_4c0 == 0) {
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "    v_color = vec4(res${PADDING});\n");
            pcVar15 = "   o_color = v_color;\n";
          }
          else {
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "    v_coords = a_coords;\n");
            pcVar15 = "   o_color = vec4(res${PADDING});\n";
          }
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar15);
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &params._M_t._M_impl.super__Rb_tree_header._M_header;
          params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName((DataType)local_4b8);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[9],_const_char_*,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [9])0x17d62f1,(char **)&fragTemplate);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x18164bb);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [10])0x1906f6b,(char (*) [8])0x18152ad);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          if ((DataType)local_4b8 == 3) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x17d30c1);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          else if ((DataType)local_4b8 == 2) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x17d30bc);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          else if ((DataType)local_4b8 == 1) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0");
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          else {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",
                       (char (*) [1])(glcts::fixed_sample_locations_values + 1));
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                     (allocator<char> *)&local_418);
          tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
          std::__cxx11::string::~string((string *)&fragTemplate.m_template);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexShaderSource,local_418._M_dataplus._M_p,&local_4c1);
          tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          std::__cxx11::string::~string((string *)&local_418);
          tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
          tcu::StringTemplate::specialize(&local_418,&fragTemplate,&params);
          pSVar12 = (ShaderIndexingCase *)operator_new(0x130);
          isVertexCase = local_4c0 == 0;
          DVar7 = (DataType)local_4b8;
          p_Var13 = getArrayCoordsEvalFunc((DataType)local_4b8);
          ShaderIndexingCase::ShaderIndexingCase
                    (pSVar12,local_3d8,_Var4._M_p,_Var3._M_p,isVertexCase,DVar7,p_Var13,
                     vertexShaderSource._M_dataplus._M_p,local_418._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          tcu::StringTemplate::~StringTemplate(&fragTemplate);
          tcu::StringTemplate::~StringTemplate(&vertTemplate);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&params);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
          tcu::TestNode::addChild((TestNode *)local_3f8,(TestNode *)pSVar12);
          std::__cxx11::string::~string((string *)&desc);
          std::__cxx11::string::~string((string *)&name);
          lVar18 = local_4c0 + 4;
        }
        uVar17 = local_3cc + 1;
      }
      iVar5 = (int)local_4b0 + 1;
    }
    pSVar27 = local_3e0;
  }
  pTVar8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar8,(pSVar27->super_TestCaseGroup).m_context,"vector_subscript",
             "Vector subscript indexing.");
  tcu::TestNode::addChild((TestNode *)pSVar27,(TestNode *)pTVar8);
  lVar14 = 0;
  do {
    if (lVar14 == 3) {
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      pSVar27 = local_3e0;
      TestCaseGroup::TestCaseGroup
                (pTVar8,(local_3e0->super_TestCaseGroup).m_context,"matrix_subscript",
                 "Matrix subscript indexing.");
      local_3c8 = pTVar8;
      tcu::TestNode::addChild((TestNode *)pSVar27,(TestNode *)pTVar8);
      lVar14 = 0;
      do {
        if (lVar14 == 9) {
          return 9;
        }
        uVar19 = (ulong)init::s_matrixTypes[lVar14];
        local_3c0 = (char *)(ulong)(init::s_matrixTypes[lVar14] - TYPE_FLOAT_MAT2);
        uVar26 = 0;
        local_4b8 = uVar19;
        while ((int)uVar26 != 2) {
          local_4b0 = (char *)CONCAT44(local_4b0._4_4_,(int)uVar26);
          for (local_3cc = 1; iVar5 = (int)uVar26, local_3cc != 4; local_3cc = local_3cc + 1) {
            uVar24 = 0;
            if (iVar5 == 0) {
              uVar24 = (ulong)local_3cc;
            }
            uVar20 = (ulong)local_3cc;
            if (iVar5 == 0) {
              uVar20 = uVar26;
            }
            pcVar10 = (char *)(&getIndexAccessTypeName(deqp::IndexAccessType)::s_names)[uVar20];
            pcVar23 = (char *)(&getIndexAccessTypeName(deqp::IndexAccessType)::s_names)[uVar24];
            iVar5 = (int)uVar20;
            iVar21 = (int)uVar24;
            local_3f0 = (TestCaseGroup *)CONCAT71(local_3f0._1_7_,iVar21 == 1 || iVar5 == 1);
            local_3f8 = (TestCaseGroup *)CONCAT71(local_3f8._1_7_,iVar21 == 3 || iVar5 == 3);
            local_4c0 = 0;
            while( true ) {
              if (local_4c0 == 8) break;
              pcVar9 = glu::getShaderTypeName
                                 (*(ShaderType *)
                                   ((long)deqp::gles2::Functional::UniformCase::
                                          randomFeatures(unsigned_int)::arrayUsageChoices +
                                   local_4c0));
              pcVar16 = glu::getDataTypeName((DataType)uVar19);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar16,(allocator<char> *)&local_418);
              std::operator+(&fragTemplate.m_template,&vertexShaderSource,"_");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,&fragTemplate.m_template,pcVar10);
              std::operator+(&vertTemplate.m_template,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,"_write_");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &frag,&vertTemplate.m_template,pcVar23);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vtx,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&frag,"_read_");
              std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&vtx,pcVar9);
              std::__cxx11::string::~string((string *)&vtx);
              std::__cxx11::string::~string((string *)&frag);
              std::__cxx11::string::~string((string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&params);
              std::__cxx11::string::~string((string *)&fragTemplate.m_template);
              std::__cxx11::string::~string((string *)&vertexShaderSource);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,"Vector subscript access with ",
                         (allocator<char> *)&local_418);
              std::operator+(&fragTemplate.m_template,&vertexShaderSource,pcVar10);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,&fragTemplate.m_template," write and ");
              std::operator+(&vertTemplate.m_template,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,pcVar23);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &frag,&vertTemplate.m_template," read in ");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vtx,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&frag,pcVar9);
              std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&vtx," shader.");
              std::__cxx11::string::~string((string *)&vtx);
              std::__cxx11::string::~string((string *)&frag);
              std::__cxx11::string::~string((string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&params);
              std::__cxx11::string::~string((string *)&fragTemplate.m_template);
              std::__cxx11::string::~string((string *)&vertexShaderSource);
              _Var4 = name._M_dataplus;
              _Var3 = desc._M_dataplus;
              pCVar2 = (local_3e0->super_TestCaseGroup).m_context;
              GVar1 = local_3e0->m_glslVersion;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              uVar19 = local_4b8;
              local_3e8 = pCVar2;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              pbVar25 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag;
              if (local_4c0 == 0) {
                pbVar25 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx;
              }
              uVar17 = glu::getDataTypeMatrixNumColumns((DataType)uVar19);
              iVar6 = glu::getDataTypeMatrixNumRows((DataType)uVar19);
              pcVar9 = getIntUniformName(uVar17);
              DVar7 = glu::getDataTypeFloatVec(iVar6);
              local_3d8 = (Context *)CONCAT44(local_3d8._4_4_,DVar7);
              pcVar16 = glu::getGLSLVersionDeclaration(GVar1);
              poVar11 = std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                                        pcVar16);
              std::operator<<(poVar11,"\n");
              pcVar16 = glu::getGLSLVersionDeclaration(GVar1);
              poVar11 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                                        pcVar16);
              std::operator<<(poVar11,"\n");
              std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                              "in highp vec4 a_position;\n");
              std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                              "in highp vec4 a_coords;\n");
              std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                              "layout(location = 0) out mediump vec4 o_color;\n");
              if (local_4c0 == 0) {
                std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                                "out mediump vec4 v_color;\n");
                pcVar16 = "in mediump vec4 v_color;\n";
              }
              else {
                std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                                "out mediump vec4 v_coords;\n");
                pcVar16 = "in mediump vec4 v_coords;\n";
              }
              std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar16);
              if ((char)local_3f0 != '\0') {
                std::operator<<((ostream *)pbVar25,"uniform mediump int ui_zero");
                if (((1 < (int)uVar17) &&
                    (std::operator<<((ostream *)pbVar25,", ui_one"), uVar17 != 2)) &&
                   (std::operator<<((ostream *)pbVar25,", ui_two"), 3 < uVar17)) {
                  std::operator<<((ostream *)pbVar25,", ui_three");
                }
                std::operator<<((ostream *)pbVar25,";\n");
              }
              if ((char)local_3f8 != '\0') {
                poVar11 = std::operator<<((ostream *)pbVar25,"uniform mediump int ");
                poVar11 = std::operator<<(poVar11,pcVar9);
                std::operator<<(poVar11,";\n");
              }
              std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
              std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                              "void main()\n");
              std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
              std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                              "    gl_Position = a_position;\n");
              std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
              std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                              "void main()\n");
              std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
              pcVar16 = " ${PRECISION} vec4 coords = v_coords;\n";
              if (local_4c0 == 0) {
                pcVar16 = " ${PRECISION} vec4 coords = a_coords;\n";
              }
              std::operator<<((ostream *)pbVar25,pcVar16);
              std::operator<<((ostream *)pbVar25," ${PRECISION} ${MAT_TYPE} tmp;\n");
              if ((int)local_4b0 == 0) {
                std::operator<<((ostream *)pbVar25," tmp[0] = ${VEC_TYPE}(coords);\n");
                if ((1 < (int)uVar17) &&
                   (std::operator<<((ostream *)pbVar25,
                                    "   tmp[1] = ${VEC_TYPE}(coords.yzwx) * 0.5;\n"), uVar17 != 2))
                {
                  std::operator<<((ostream *)pbVar25,
                                  "   tmp[2] = ${VEC_TYPE}(coords.zwxy) * 0.25;\n");
                  pcVar16 = "   tmp[3] = ${VEC_TYPE}(coords.wxyz) * 0.125;\n";
LAB_00d65e53:
                  if (3 < uVar17) goto LAB_00d65ee3;
                }
              }
              else if (iVar5 == 1) {
                std::operator<<((ostream *)pbVar25," tmp[ui_zero]  = ${VEC_TYPE}(coords);\n");
                if ((1 < (int)uVar17) &&
                   (std::operator<<((ostream *)pbVar25,
                                    "   tmp[ui_one]   = ${VEC_TYPE}(coords.yzwx) * 0.5;\n"),
                   uVar17 != 2)) {
                  std::operator<<((ostream *)pbVar25,
                                  "   tmp[ui_two]   = ${VEC_TYPE}(coords.zwxy) * 0.25;\n");
                  pcVar16 = "   tmp[ui_three] = ${VEC_TYPE}(coords.wxyz) * 0.125;\n";
                  goto LAB_00d65e53;
                }
              }
              else {
                if (local_3cc == 2) {
                  poVar11 = std::operator<<((ostream *)pbVar25," for (int i = 0; i < ");
                  poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar17);
                }
                else {
                  poVar11 = std::operator<<((ostream *)pbVar25," for (int i = 0; i < ");
                  poVar11 = std::operator<<(poVar11,pcVar9);
                }
                std::operator<<(poVar11,"; i++)\n");
                std::operator<<((ostream *)pbVar25," {\n");
                std::operator<<((ostream *)pbVar25,"     tmp[i] = ${VEC_TYPE}(coords);\n");
                std::operator<<((ostream *)pbVar25,"     coords = coords.yzwx * 0.5;\n");
                pcVar16 = " }\n";
LAB_00d65ee3:
                std::operator<<((ostream *)pbVar25,pcVar16);
              }
              std::operator<<((ostream *)pbVar25,
                              " ${PRECISION} ${VEC_TYPE} res = ${VEC_TYPE}(0.0);\n");
              if ((int)local_4b0 == 0) {
                if (iVar21 == 1) {
                  std::operator<<((ostream *)pbVar25," res += tmp[ui_zero];\n");
                  if ((1 < (int)uVar17) &&
                     (std::operator<<((ostream *)pbVar25,"   res += tmp[ui_one];\n"), uVar17 != 2))
                  {
                    std::operator<<((ostream *)pbVar25,"   res += tmp[ui_two];\n");
                    pcVar9 = "    res += tmp[ui_three];\n";
                    goto LAB_00d65f98;
                  }
                }
                else {
                  if (iVar21 == 2) {
                    poVar11 = std::operator<<((ostream *)pbVar25," for (int i = 0; i < ");
                    poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar17);
                  }
                  else {
                    poVar11 = std::operator<<((ostream *)pbVar25," for (int i = 0; i < ");
                    poVar11 = std::operator<<(poVar11,pcVar9);
                  }
                  std::operator<<(poVar11,"; i++)\n");
                  pcVar9 = "     res += tmp[i];\n";
LAB_00d65fef:
                  std::operator<<((ostream *)pbVar25,pcVar9);
                }
              }
              else {
                std::operator<<((ostream *)pbVar25," res += tmp[0];\n");
                if ((1 < (int)uVar17) &&
                   (std::operator<<((ostream *)pbVar25,"   res += tmp[1];\n"), uVar17 != 2)) {
                  std::operator<<((ostream *)pbVar25,"   res += tmp[2];\n");
                  pcVar9 = "    res += tmp[3];\n";
LAB_00d65f98:
                  pcVar9 = pcVar9 + 1;
                  if (3 < uVar17) goto LAB_00d65fef;
                }
              }
              if (local_4c0 == 0) {
                std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                                "    v_color = vec4(res${PADDING});\n");
                pcVar9 = "   o_color = v_color;\n";
              }
              else {
                std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                                "    v_coords = a_coords;\n");
                pcVar9 = "   o_color = vec4(res${PADDING});\n";
              }
              std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar9);
              std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
              std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName((DataType)local_4b8);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])"MAT_TYPE",(char **)&fragTemplate.m_template
                        );
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              uVar26 = (ulong)local_4b0 & 0xffffffff;
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&vertTemplate);
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName((DataType)local_3d8);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])"VEC_TYPE",(char **)&fragTemplate.m_template
                        );
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&vertTemplate);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0x1906f6b,(char (*) [8])0x18152ad);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&vertTemplate);
              if (iVar6 == 3) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x17d30c1);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (iVar6 == 2) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x17d30bc);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",
                           (char (*) [1])(glcts::fixed_sample_locations_values + 1));
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&vertTemplate);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                         (allocator<char> *)&local_418);
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              std::__cxx11::string::~string((string *)&fragTemplate.m_template);
              std::__cxx11::string::~string((string *)&vertexShaderSource);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,local_418._M_dataplus._M_p,&local_4c1);
              tcu::StringTemplate::StringTemplate
                        ((StringTemplate *)&fragTemplate.m_template,&vertexShaderSource);
              std::__cxx11::string::~string((string *)&vertexShaderSource);
              std::__cxx11::string::~string((string *)&local_418);
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize
                        (&local_418,(StringTemplate *)&fragTemplate.m_template,&params);
              if ((uint)local_3c0 < 9) {
                p_Var13 = (ShaderEvalFunc)(&PTR_evalSubscriptMat2_01e059b8)[(long)local_3c0];
              }
              else {
                p_Var13 = (ShaderEvalFunc)0x0;
              }
              pSVar12 = (ShaderIndexingCase *)operator_new(0x130);
              ShaderIndexingCase::ShaderIndexingCase
                        (pSVar12,local_3e8,_Var4._M_p,_Var3._M_p,local_4c0 == 0,(DataType)local_4b8,
                         p_Var13,vertexShaderSource._M_dataplus._M_p,local_418._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&local_418);
              std::__cxx11::string::~string((string *)&vertexShaderSource);
              tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragTemplate.m_template);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&params._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              tcu::TestNode::addChild((TestNode *)local_3c8,(TestNode *)pSVar12);
              uVar19 = local_4b8;
              std::__cxx11::string::~string((string *)&desc);
              std::__cxx11::string::~string((string *)&name);
              local_4c0 = local_4c0 + 4;
            }
          }
          uVar26 = (ulong)(iVar5 + 1);
        }
        lVar14 = lVar14 + 1;
      } while( true );
    }
    local_4b8 = (ulong)init::s_vectorTypes[lVar14];
    local_3c8 = (TestCaseGroup *)(ulong)(init::s_vectorTypes[lVar14] - TYPE_FLOAT_VEC2);
    for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
      local_3c0 = (char *)CONCAT44(local_3c0._4_4_,iVar5);
      for (uVar17 = 2; uVar17 != 6; uVar17 = uVar17 + 1) {
        uVar19 = 0;
        if (iVar5 == 0) {
          uVar19 = (ulong)uVar17;
        }
        uVar26 = (ulong)uVar17;
        if (iVar5 == 0) {
          uVar26 = 0;
        }
        local_4b0 = (char *)(&getVectorAccessTypeName(deqp::VectorAccessType)::s_names)[uVar26];
        pcVar10 = (char *)(&getVectorAccessTypeName(deqp::VectorAccessType)::s_names)[uVar19];
        iVar6 = (int)uVar26;
        iVar21 = (int)uVar19;
        local_3e8 = (Context *)CONCAT71(local_3e8._1_7_,iVar21 == 3 || iVar6 == 3);
        local_3f0 = (TestCaseGroup *)CONCAT71(local_3f0._1_7_,iVar21 == 5 || iVar6 == 5);
        local_3f8 = (TestCaseGroup *)CONCAT44(local_3f8._4_4_,uVar17);
        lVar18 = 0;
        while (lVar18 != 8) {
          local_4c0 = lVar18;
          pcVar23 = glu::getShaderTypeName
                              (*(ShaderType *)
                                ((long)deqp::gles2::Functional::UniformCase::
                                       randomFeatures(unsigned_int)::arrayUsageChoices + lVar18));
          pcVar9 = glu::getDataTypeName((DataType)local_4b8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexShaderSource,pcVar9,(allocator<char> *)&local_418);
          std::operator+(&fragTemplate.m_template,&vertexShaderSource,"_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,&fragTemplate.m_template,local_4b0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vertTemplate,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,"_write_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vertTemplate,pcVar10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         "_read_");
          std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vtx,pcVar23);
          std::__cxx11::string::~string((string *)&vtx);
          std::__cxx11::string::~string((string *)&frag);
          std::__cxx11::string::~string((string *)&vertTemplate);
          std::__cxx11::string::~string((string *)&params);
          std::__cxx11::string::~string((string *)&fragTemplate.m_template);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexShaderSource,"Vector subscript access with ",
                     (allocator<char> *)&local_418);
          std::operator+(&fragTemplate.m_template,&vertexShaderSource,local_4b0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,&fragTemplate.m_template," write and ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vertTemplate,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,pcVar10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vertTemplate," read in ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         pcVar23);
          std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vtx," shader.");
          std::__cxx11::string::~string((string *)&vtx);
          std::__cxx11::string::~string((string *)&frag);
          std::__cxx11::string::~string((string *)&vertTemplate);
          std::__cxx11::string::~string((string *)&params);
          std::__cxx11::string::~string((string *)&fragTemplate);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          _Var4 = name._M_dataplus;
          _Var3 = desc._M_dataplus;
          pCVar2 = (local_3e0->super_TestCaseGroup).m_context;
          GVar1 = local_3e0->m_glslVersion;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
          local_3d8 = (Context *)_Var4._M_p;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
          psVar28 = (string *)&frag;
          if (local_4c0 == 0) {
            psVar28 = (string *)&vtx;
          }
          uVar17 = glu::getDataTypeScalarSize((DataType)local_4b8);
          pcVar23 = getIntUniformName(uVar17);
          pcVar9 = glu::getGLSLVersionDeclaration(GVar1);
          poVar11 = std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar9);
          std::operator<<(poVar11,"\n");
          pcVar9 = glu::getGLSLVersionDeclaration(GVar1);
          poVar11 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar9)
          ;
          std::operator<<(poVar11,"\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "in highp vec4 a_position;\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "in highp vec4 a_coords;\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                          "layout(location = 0) out mediump vec4 o_color;\n");
          if (local_4c0 == 0) {
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "out mediump vec3 v_color;\n");
            pcVar9 = "in mediump vec3 v_color;\n";
          }
          else {
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "out mediump vec4 v_coords;\n");
            pcVar9 = "in mediump vec4 v_coords;\n";
          }
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar9);
          if ((char)local_3e8 != '\0') {
            std::operator<<((ostream *)psVar28,"uniform mediump int ui_zero");
            if (((1 < (int)uVar17) && (std::operator<<((ostream *)psVar28,", ui_one"), uVar17 != 2))
               && (std::operator<<((ostream *)psVar28,", ui_two"), 3 < uVar17)) {
              std::operator<<((ostream *)psVar28,", ui_three");
            }
            std::operator<<((ostream *)psVar28,";\n");
          }
          if ((char)local_3f0 != '\0') {
            poVar11 = std::operator<<((ostream *)psVar28,"uniform mediump int ");
            poVar11 = std::operator<<(poVar11,pcVar23);
            std::operator<<(poVar11,";\n");
          }
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "    gl_Position = a_position;\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
          pcVar9 = " ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";
          if (local_4c0 == 0) {
            pcVar9 = " ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
          }
          std::operator<<((ostream *)psVar28,pcVar9);
          std::operator<<((ostream *)psVar28," ${PRECISION} ${VAR_TYPE} tmp;\n");
          pcVar9 = " tmp = coords.${SWIZZLE} * vec4(1.0, 0.5, 0.25, 0.125).${SWIZZLE};\n";
          if (iVar6 == 0) {
LAB_00d65358:
            std::operator<<((ostream *)psVar28,pcVar9);
          }
          else if (iVar6 == 2) {
            std::operator<<((ostream *)psVar28," tmp[0] = coords.x;\n");
            if ((1 < (int)uVar17) &&
               (std::operator<<((ostream *)psVar28,"    tmp[1] = coords.y * 0.5;\n"), uVar17 != 2))
            {
              std::operator<<((ostream *)psVar28,"    tmp[2] = coords.z * 0.25;\n");
              pcVar9 = "    tmp[3] = coords.w * 0.125;\n";
LAB_00d652cb:
              if (3 < uVar17) goto LAB_00d65358;
            }
          }
          else if (iVar6 == 1) {
            std::operator<<((ostream *)psVar28," tmp.x = coords.x;\n");
            if ((1 < (int)uVar17) &&
               (std::operator<<((ostream *)psVar28,"    tmp.y = coords.y * 0.5;\n"), uVar17 != 2)) {
              std::operator<<((ostream *)psVar28,"    tmp.z = coords.z * 0.25;\n");
              pcVar9 = "    tmp.w = coords.w * 0.125;\n";
              goto LAB_00d652cb;
            }
          }
          else {
            if (iVar6 != 3) {
              if (iVar6 == 4) {
                poVar11 = std::operator<<((ostream *)psVar28," for (int i = 0; i < ");
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar17);
              }
              else {
                poVar11 = std::operator<<((ostream *)psVar28," for (int i = 0; i < ");
                poVar11 = std::operator<<(poVar11,pcVar23);
              }
              std::operator<<(poVar11,"; i++)\n");
              std::operator<<((ostream *)psVar28," {\n");
              std::operator<<((ostream *)psVar28,"     tmp[i] = coords.x;\n");
              std::operator<<((ostream *)psVar28,"     coords = coords.${ROT_SWIZZLE} * 0.5;\n");
              pcVar9 = " }\n";
              goto LAB_00d65358;
            }
            std::operator<<((ostream *)psVar28," tmp[ui_zero]  = coords.x;\n");
            if ((1 < (int)uVar17) &&
               (std::operator<<((ostream *)psVar28,"    tmp[ui_one]   = coords.y * 0.5;\n"),
               uVar17 != 2)) {
              std::operator<<((ostream *)psVar28,"    tmp[ui_two]   = coords.z * 0.25;\n");
              pcVar9 = "    tmp[ui_three] = coords.w * 0.125;\n";
              goto LAB_00d652cb;
            }
          }
          std::operator<<((ostream *)psVar28," ${PRECISION} float res = 0.0;\n");
          pcVar9 = " res = dot(tmp, ${VAR_TYPE}(1.0));\n";
          if (iVar21 == 0) {
LAB_00d654d3:
            std::operator<<((ostream *)psVar28,pcVar9);
          }
          else if (iVar21 == 2) {
            std::operator<<((ostream *)psVar28," res += tmp[0];\n");
            if ((1 < (int)uVar17) &&
               (std::operator<<((ostream *)psVar28,"    res += tmp[1];\n"), uVar17 != 2)) {
              std::operator<<((ostream *)psVar28,"    res += tmp[2];\n");
              pcVar9 = "    res += tmp[3];\n";
LAB_00d6547a:
              if (3 < uVar17) goto LAB_00d654d3;
            }
          }
          else if (iVar21 == 1) {
            std::operator<<((ostream *)psVar28," res += tmp.x;\n");
            if ((1 < (int)uVar17) &&
               (std::operator<<((ostream *)psVar28,"    res += tmp.y;\n"), uVar17 != 2)) {
              std::operator<<((ostream *)psVar28,"    res += tmp.z;\n");
              pcVar9 = "    res += tmp.w;\n";
              goto LAB_00d6547a;
            }
          }
          else {
            if (iVar21 != 3) {
              if (iVar21 == 4) {
                poVar11 = std::operator<<((ostream *)psVar28," for (int i = 0; i < ");
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar17);
              }
              else {
                poVar11 = std::operator<<((ostream *)psVar28," for (int i = 0; i < ");
                poVar11 = std::operator<<(poVar11,pcVar23);
              }
              std::operator<<(poVar11,"; i++)\n");
              pcVar9 = "     res += tmp[i];\n";
              goto LAB_00d654d3;
            }
            std::operator<<((ostream *)psVar28," res += tmp[ui_zero];\n");
            if ((1 < (int)uVar17) &&
               (std::operator<<((ostream *)psVar28,"    res += tmp[ui_one];\n"), uVar17 != 2)) {
              std::operator<<((ostream *)psVar28,"    res += tmp[ui_two];\n");
              pcVar9 = "    res += tmp[ui_three];\n";
              goto LAB_00d6547a;
            }
          }
          if (local_4c0 == 0) {
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "    v_color = vec3(res);\n");
            pcVar23 = "   o_color = vec4(v_color.rgb, 1.0);\n";
          }
          else {
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "    v_coords = a_coords;\n");
            pcVar23 = "   o_color = vec4(vec3(res), 1.0);\n";
          }
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar23);
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &params._M_t._M_impl.super__Rb_tree_header._M_header;
          params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName((DataType)local_4b8);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[9],_const_char_*,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [9])0x17d62f1,(char **)&fragTemplate);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [10])0x1906f6b,(char (*) [8])0x18152ad);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_*&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])0x16f959e,
                     (char **)(createVectorSubscriptCase(deqp::Context&,char_const*,char_const*,glu::GLSLVersion,bool,glu::DataType,deqp::VectorAccessType,deqp::VectorAccessType)
                               ::s_swizzles + (long)(int)uVar17 * 8));
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[12],_const_char_*&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [12])"ROT_SWIZZLE",
                     (char **)(createVectorSubscriptCase(deqp::Context&,char_const*,char_const*,glu::GLSLVersion,bool,glu::DataType,deqp::VectorAccessType,deqp::VectorAccessType)
                               ::s_rotSwizzles + (long)(int)uVar17 * 8));
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                     (allocator<char> *)&local_418);
          tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
          std::__cxx11::string::~string((string *)&fragTemplate.m_template);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexShaderSource,local_418._M_dataplus._M_p,&local_4c1);
          tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          std::__cxx11::string::~string((string *)&local_418);
          tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
          tcu::StringTemplate::specialize(&local_418,&fragTemplate,&params);
          if ((uint)local_3c8 < 3) {
            p_Var13 = (ShaderEvalFunc)(&PTR_evalSubscriptVec2_01e059a0)[(long)local_3c8];
          }
          else {
            p_Var13 = (ShaderEvalFunc)0x0;
          }
          pSVar12 = (ShaderIndexingCase *)operator_new(0x130);
          ShaderIndexingCase::ShaderIndexingCase
                    (pSVar12,pCVar2,(char *)local_3d8,_Var3._M_p,local_4c0 == 0,(DataType)local_4b8,
                     p_Var13,vertexShaderSource._M_dataplus._M_p,local_418._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          tcu::StringTemplate::~StringTemplate(&fragTemplate);
          tcu::StringTemplate::~StringTemplate(&vertTemplate);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&params._M_t);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
          tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)pSVar12);
          std::__cxx11::string::~string((string *)&desc);
          std::__cxx11::string::~string((string *)&name);
          iVar5 = (int)local_3c0;
          uVar17 = (uint)local_3f8;
          lVar18 = local_4c0 + 4;
        }
      }
    }
    lVar14 = lVar14 + 1;
  } while( true );
}

Assistant:

void ShaderIndexingTests::init(void)
{
	static const DataType s_floatAndVecTypes[] = { TYPE_FLOAT, TYPE_FLOAT_VEC2, TYPE_FLOAT_VEC3, TYPE_FLOAT_VEC4 };

	static const ShaderType s_shaderTypes[] = { SHADERTYPE_VERTEX, SHADERTYPE_FRAGMENT };

	// Varying array access cases.
	{
		TestCaseGroup* varyingGroup = new TestCaseGroup(m_context, "varying_array", "Varying array access tests.");
		addChild(varyingGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int vertAccess = 0; vertAccess < INDEXACCESS_LAST; vertAccess++)
			{
				for (int fragAccess = 0; fragAccess < INDEXACCESS_LAST; fragAccess++)
				{
					if (vertAccess == INDEXACCESS_STATIC && fragAccess == INDEXACCESS_STATIC)
						continue;

					const char* vertAccessName = getIndexAccessTypeName((IndexAccessType)vertAccess);
					const char* fragAccessName = getIndexAccessTypeName((IndexAccessType)fragAccess);
					string		name =
						string(getDataTypeName(varType)) + "_" + vertAccessName + "_write_" + fragAccessName + "_read";
					string desc = string("Varying array with ") + vertAccessName + " write in vertex shader and " +
								  fragAccessName + " read in fragment shader.";
					varyingGroup->addChild(createVaryingArrayCase(m_context, name.c_str(), desc.c_str(), m_glslVersion,
																  varType, (IndexAccessType)vertAccess,
																  (IndexAccessType)fragAccess));
				}
			}
		}
	}

	// Uniform array access cases.
	{
		TestCaseGroup* uniformGroup = new TestCaseGroup(m_context, "uniform_array", "Uniform array access tests.");
		addChild(uniformGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
			{
				const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);
				for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
				{
					ShaderType  shaderType	 = s_shaderTypes[shaderTypeNdx];
					const char* shaderTypeName = getShaderTypeName((ShaderType)shaderType);
					string name = string(getDataTypeName(varType)) + "_" + readAccessName + "_read_" + shaderTypeName;
					string desc =
						string("Uniform array with ") + readAccessName + " read in " + shaderTypeName + " shader.";
					bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
					uniformGroup->addChild(createUniformArrayCase(m_context, name.c_str(), desc.c_str(), m_glslVersion,
																  isVertexCase, varType, (IndexAccessType)readAccess));
				}
			}
		}
	}

	// Temporary array access cases.
	{
		TestCaseGroup* tmpGroup = new TestCaseGroup(m_context, "tmp_array", "Temporary array access tests.");
		addChild(tmpGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int isReadStatic = 0; isReadStatic < 2; isReadStatic++)
			{
				for (int access = INDEXACCESS_STATIC + 1; access < INDEXACCESS_LAST; access++)
				{
					IndexAccessType readAccess  = isReadStatic ? INDEXACCESS_STATIC : (IndexAccessType)access;
					IndexAccessType writeAccess = isReadStatic ? (IndexAccessType)access : INDEXACCESS_STATIC;

					const char* writeAccessName = getIndexAccessTypeName(writeAccess);
					const char* readAccessName  = getIndexAccessTypeName(readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType  shaderType	 = s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName = getShaderTypeName((ShaderType)shaderType);
						string		name = string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" +
									  readAccessName + "_read_" + shaderTypeName;
						string desc = string("Temporary array with ") + writeAccessName + " write and " +
									  readAccessName + " read in " + shaderTypeName + " shader.";
						bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						tmpGroup->addChild(createTmpArrayCase(m_context, name.c_str(), desc.c_str(), m_glslVersion,
															  isVertexCase, varType, (IndexAccessType)writeAccess,
															  (IndexAccessType)readAccess));
					}
				}
			}
		}
	}

	// Vector indexing with subscripts.
	{
		TestCaseGroup* vecGroup = new TestCaseGroup(m_context, "vector_subscript", "Vector subscript indexing.");
		addChild(vecGroup);

		static const DataType s_vectorTypes[] = { TYPE_FLOAT_VEC2, TYPE_FLOAT_VEC3, TYPE_FLOAT_VEC4 };

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_vectorTypes); typeNdx++)
		{
			DataType varType = s_vectorTypes[typeNdx];
			for (int isReadDirect = 0; isReadDirect < 2; isReadDirect++)
			{
				for (int access = SUBSCRIPT_STATIC; access < VECTORACCESS_LAST; access++)
				{
					VectorAccessType readAccess  = isReadDirect ? DIRECT : (VectorAccessType)access;
					VectorAccessType writeAccess = isReadDirect ? (VectorAccessType)access : DIRECT;

					const char* writeAccessName = getVectorAccessTypeName(writeAccess);
					const char* readAccessName  = getVectorAccessTypeName(readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType  shaderType	 = s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName = getShaderTypeName((ShaderType)shaderType);
						string		name = string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" +
									  readAccessName + "_read_" + shaderTypeName;
						string desc = string("Vector subscript access with ") + writeAccessName + " write and " +
									  readAccessName + " read in " + shaderTypeName + " shader.";
						bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						vecGroup->addChild(createVectorSubscriptCase(
							m_context, name.c_str(), desc.c_str(), m_glslVersion, isVertexCase, varType,
							(VectorAccessType)writeAccess, (VectorAccessType)readAccess));
					}
				}
			}
		}
	}

	// Matrix indexing with subscripts.
	{
		TestCaseGroup* matGroup = new TestCaseGroup(m_context, "matrix_subscript", "Matrix subscript indexing.");
		addChild(matGroup);

		static const DataType s_matrixTypes[] = { TYPE_FLOAT_MAT2,   TYPE_FLOAT_MAT2X3, TYPE_FLOAT_MAT2X4,
												  TYPE_FLOAT_MAT3X2, TYPE_FLOAT_MAT3,   TYPE_FLOAT_MAT3X4,
												  TYPE_FLOAT_MAT4X2, TYPE_FLOAT_MAT4X3, TYPE_FLOAT_MAT4 };

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_matrixTypes); typeNdx++)
		{
			DataType varType = s_matrixTypes[typeNdx];
			for (int isReadStatic = 0; isReadStatic < 2; isReadStatic++)
			{
				for (int access = INDEXACCESS_STATIC + 1; access < INDEXACCESS_LAST; access++)
				{
					IndexAccessType readAccess  = isReadStatic ? INDEXACCESS_STATIC : (IndexAccessType)access;
					IndexAccessType writeAccess = isReadStatic ? (IndexAccessType)access : INDEXACCESS_STATIC;

					const char* writeAccessName = getIndexAccessTypeName(writeAccess);
					const char* readAccessName  = getIndexAccessTypeName(readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType  shaderType	 = s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName = getShaderTypeName((ShaderType)shaderType);
						string		name = string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" +
									  readAccessName + "_read_" + shaderTypeName;
						string desc = string("Vector subscript access with ") + writeAccessName + " write and " +
									  readAccessName + " read in " + shaderTypeName + " shader.";
						bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						matGroup->addChild(createMatrixSubscriptCase(
							m_context, name.c_str(), desc.c_str(), m_glslVersion, isVertexCase, varType,
							(IndexAccessType)writeAccess, (IndexAccessType)readAccess));
					}
				}
			}
		}
	}
}